

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

void __thiscall cfd::core::ExtPrivkey::ExtPrivkey(ExtPrivkey *this,string *base58_data)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  ByteData256::ByteData256((ByteData256 *)&local_30);
  ExtPrivkey(this,base58_data,(ByteData256 *)&local_30);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  return;
}

Assistant:

ExtPrivkey::ExtPrivkey(const std::string& base58_data)
    : ExtPrivkey(base58_data, ByteData256()) {
  // do nothing
}